

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_context_reg_write_batch(uc_context *ctx,int *regs,void **vals,int count)

{
  uc_mode mode;
  uc_err uVar1;
  ulong uVar2;
  context_reg_rw_t cVar3;
  int setpc;
  size_t size;
  int local_4c;
  int *local_48;
  void **local_40;
  size_t local_38;
  
  mode = ctx->mode;
  local_48 = regs;
  local_40 = vals;
  cVar3 = find_context_reg_rw(ctx->arch,mode);
  local_4c = 0;
  if (0 < count) {
    uVar2 = 0;
    do {
      local_38 = 0xffffffffffffffff;
      uVar1 = (*cVar3.write)(&ctx->field_0x14,mode,local_48[uVar2],local_40[uVar2],&local_38,
                             &local_4c);
      if (uVar1 != UC_ERR_OK) {
        return uVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  return UC_ERR_OK;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_write_batch(uc_context *ctx, int *regs, void *const *vals,
                                  int count)
{
    reg_write_t reg_write = find_context_reg_rw(ctx->arch, ctx->mode).write;
    void *env = ctx->data;
    int mode = ctx->mode;
    int setpc = 0;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        const void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_write(env, mode, regid, value, &size, &setpc);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}